

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_write_simple_object(sexp ctx,sexp self,sexp_sint_t n,sexp obj,sexp writer,sexp out)

{
  ushort uVar1;
  short sVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  sexp ctx_00;
  sexp n_00;
  sexp_conflict self_00;
  uint *in_RCX;
  long in_RDI;
  int *in_R8;
  long in_R9;
  sexp_sint_t nulls;
  sexp_sint_t len;
  sexp_sint_t i;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp args;
  sexp x;
  sexp t;
  sexp_conflict in_stack_000001d0;
  sexp_conflict in_stack_000001d8;
  sexp_conflict in_stack_000001e0;
  sexp in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  long local_70;
  long local_60;
  sexp out_00;
  sexp exn;
  undefined8 uVar7;
  undefined8 ctx_01;
  
  memset(&stack0xffffffffffffffa8,0,0x10);
  local_70 = 0;
  ctx_00 = (sexp)(ulong)*in_RCX;
  if (*(long *)(in_R9 + 0x28) == 0) {
    putc(0x7b,*(FILE **)(in_R9 + 0x20));
  }
  else if (*(ulong *)(in_R9 + 0x38) < *(ulong *)(in_R9 + 0x50)) {
    lVar3 = *(long *)(in_R9 + 0x38);
    *(long *)(in_R9 + 0x38) = lVar3 + 1;
    *(undefined1 *)(*(long *)(in_R9 + 0x28) + lVar3) = 0x7b;
    in_stack_ffffffffffffff8c = 0;
  }
  else {
    in_stack_ffffffffffffff8c =
         sexp_buffered_write_char
                   ((sexp)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  }
  uVar4 = *(ulong *)(*(long *)(in_RDI + 0x28) + 0x30);
  auVar6._8_8_ = (long)uVar4 >> 0x3f;
  auVar6._0_8_ = uVar4 & 0xfffffffffffffffe;
  if ((long)ctx_00 < SUB168(auVar6 / SEXT816(2),0)) {
    out_00 = (sexp)&stack0xffffffffffffffb8;
    exn = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa8;
    ctx_01 = *(long *)(*(long *)(*(long *)(in_RDI + 0x28) + 0x20) + 0x10 + (ulong)*in_RCX * 8);
    if (*(long *)(in_R9 + 0x28) == 0) {
      fputs((((((((sexp)ctx_01)->value).type.name)->value).type.name)->value).flonum_bits + 8 +
            (long)(((((sexp)ctx_01)->value).type.name)->value).type.cpl,*(FILE **)(in_R9 + 0x20));
    }
    else {
      sexp_buffered_write_string
                (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    if (*(long *)(in_R9 + 0x28) == 0) {
      putc(0x20,*(FILE **)(in_R9 + 0x20));
    }
    else if (*(ulong *)(in_R9 + 0x38) < *(ulong *)(in_R9 + 0x50)) {
      lVar3 = *(long *)(in_R9 + 0x38);
      *(long *)(in_R9 + 0x38) = lVar3 + 1;
      *(undefined1 *)(*(long *)(in_R9 + 0x28) + lVar3) = 0x20;
      in_stack_ffffffffffffff7c = 0;
    }
    else {
      in_stack_ffffffffffffff7c =
           sexp_buffered_write_char
                     ((sexp)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    }
    if (((((sexp)ctx_01)->value).type.id == (sexp)0x0) ||
       ((((sexp)ctx_01)->value).type.id == (sexp)0x3e)) {
      if (*(long *)(in_R9 + 0x28) == 0) {
        putc(0x23,*(FILE **)(in_R9 + 0x20));
      }
      else if (*(ulong *)(in_R9 + 0x38) < *(ulong *)(in_R9 + 0x50)) {
        lVar3 = *(long *)(in_R9 + 0x38);
        *(long *)(in_R9 + 0x38) = lVar3 + 1;
        *(undefined1 *)(*(long *)(in_R9 + 0x28) + lVar3) = 0x23;
        in_stack_ffffffffffffff78 = 0;
      }
      else {
        in_stack_ffffffffffffff78 =
             sexp_buffered_write_char
                       ((sexp)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
      }
      sexp_write_op((sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),ctx_00,
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
    }
    else {
      sexp_write_op((sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),ctx_00,
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68);
    }
    lVar3 = *(long *)((long)in_RCX + (long)(int)(((sexp)ctx_01)->value).type.field_len_off);
    uVar1 = (((sexp)ctx_01)->value).type.field_len_scale;
    sVar2 = (((sexp)ctx_01)->value).type.field_len_base;
    n_00 = sexp_cons_op((sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),ctx_00,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    for (local_60 = 0; local_60 < (long)(lVar3 * (ulong)uVar1 + (long)sVar2);
        local_60 = local_60 + 1) {
      uVar7 = *(undefined8 *)(in_RCX + local_60 * 2 + 2);
      if ((double)uVar7 == 0.0) {
        local_70 = local_70 + 1;
      }
      else {
        for (; local_70 != 0; local_70 = local_70 + -1) {
          if (*(long *)(in_R9 + 0x28) == 0) {
            fputs(" #f",*(FILE **)(in_R9 + 0x20));
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          }
        }
        if (*(long *)(in_R9 + 0x28) == 0) {
          putc(0x20,*(FILE **)(in_R9 + 0x20));
        }
        else if (*(ulong *)(in_R9 + 0x38) < *(ulong *)(in_R9 + 0x50)) {
          lVar5 = *(long *)(in_R9 + 0x38);
          *(long *)(in_R9 + 0x38) = lVar5 + 1;
          *(undefined1 *)(*(long *)(in_R9 + 0x28) + lVar5) = 0x20;
          in_stack_ffffffffffffff74 = 0;
        }
        else {
          in_stack_ffffffffffffff74 =
               sexp_buffered_write_char
                         ((sexp)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
        }
        if ((in_R8 == (int *)0x0) ||
           (((((ulong)in_R8 & 3) != 0 || (*in_R8 != 0x14)) &&
            ((((ulong)in_R8 & 3) != 0 || (*in_R8 != 0x1b)))))) {
          sexp_write_op((sexp)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),ctx_00,
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
        }
        else {
          (n_00->value).flonum = (double)uVar7;
          self_00 = sexp_apply(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
          if ((((ulong)self_00 & 3) == 0) && (self_00->tag == 0x13)) {
            sexp_print_exception_op((sexp)ctx_01,self_00,(sexp_sint_t)n_00,exn,out_00);
          }
        }
      }
    }
    *(sexp *)(in_RDI + 0x6080) = exn;
  }
  else if (*(long *)(in_R9 + 0x28) == 0) {
    fputs("invalid",*(FILE **)(in_R9 + 0x20));
  }
  else {
    sexp_buffered_write_string
              (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (sexp)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  if (*(long *)(in_R9 + 0x28) == 0) {
    putc(0x7d,*(FILE **)(in_R9 + 0x20));
  }
  else if (*(ulong *)(in_R9 + 0x38) < *(ulong *)(in_R9 + 0x50)) {
    lVar3 = *(long *)(in_R9 + 0x38);
    *(long *)(in_R9 + 0x38) = lVar3 + 1;
    *(undefined1 *)(*(long *)(in_R9 + 0x28) + lVar3) = 0x7d;
  }
  else {
    sexp_buffered_write_char
              ((sexp)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  }
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_write_simple_object (sexp ctx, sexp self, sexp_sint_t n, sexp obj, sexp writer, sexp out) {
  sexp t, x;
  sexp_gc_var1(args);
  sexp_sint_t i, len, nulls=0;
  i = sexp_pointer_tag(obj);
  sexp_write_char(ctx, '{', out);
  if (i >= sexp_context_num_types(ctx)) {
    sexp_write_string(ctx, "invalid", out);
  } else {
    sexp_gc_preserve1(ctx, args);
    t = sexp_object_type(ctx, obj);
    sexp_write_string(ctx, sexp_string_data(sexp_type_name(t)), out);
    sexp_write_char(ctx, ' ', out);
    if (sexp_type_id(t) && sexp_truep(sexp_type_id(t))) {
      sexp_write(ctx, sexp_type_id(t), out);
    } else {
      sexp_write_char(ctx, '#', out);
      sexp_write(ctx, sexp_make_fixnum(sexp_type_tag(t)), out);
    }
    len = sexp_type_num_slots_of_object(t, obj);
    args = sexp_list1(ctx, SEXP_FALSE);
    for (i=0; i<len; i++) {
      x = sexp_slot_ref(obj, i);
      if (x) {
        for ( ; nulls; --nulls)
          sexp_write_string(ctx, " #f", out);
        sexp_write_char(ctx, ' ', out);
        if (writer && sexp_applicablep(writer)) {
          sexp_car(args) = x;
          x = sexp_apply(ctx, writer, args);
          if (sexp_exceptionp(x)) sexp_print_exception(ctx, x, out);
        } else {
          sexp_write(ctx, sexp_slot_ref(obj, i), out);
        }
      } else {
        nulls++;
      }
    }
    sexp_gc_release1(ctx);
  }
  sexp_write_char(ctx, '}', out);
  return SEXP_VOID;
}